

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory_computer.h
# Opt level: O0

void __thiscall
directed_flag_complex_in_memory_computer::compute_filtration_t::operator()
          (compute_filtration_t *this,vertex_index_t *first_vertex,int size,
          pair<int,_float> *param_4)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  pair<int,_float> *ppVar5;
  int in_EDX;
  pair<int,_float> in_RSI;
  int *in_RDI;
  int i;
  directed_flag_complex_cell_t cell;
  value_t nf;
  unsigned_short *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  int dimension;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff80;
  directed_flag_complex_boundary_cell_t *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *in_stack_ffffffffffffffb0;
  int local_3c;
  directed_flag_complex_cell_t local_38;
  undefined4 local_24;
  int local_14;
  pair<int,_float> local_10;
  
  *in_RDI = *in_RDI + 1;
  local_24 = 0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 2) != 0) {
    directed_flag_complex_cell_t::directed_flag_complex_cell_t(&local_38,(vertex_index_t *)in_RSI);
    if ((uint)cell_hasher_t::dimension != local_14 - 2U) {
      cell_hasher_t::set_current_cell_dimension((short)local_14 - 2);
    }
    uVar3 = (**(code **)(**(long **)(in_RDI + 2) + 0x28))();
    if ((uVar3 & 1) == 0) {
      local_24 = (**(code **)(**(long **)(in_RDI + 2) + 0x10))
                           (*(long **)(in_RDI + 2),(short)local_14 + -1,&local_38,
                            *(undefined8 *)(in_RDI + 4),0);
    }
    else {
      if (*(long *)(in_RDI + 8) == 0) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)local_14;
        uVar3 = SUB168(auVar1 * ZEXT816(4),0);
        if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
          uVar3 = 0xffffffffffffffff;
        }
        pvVar4 = operator_new__(uVar3);
        *(void **)(in_RDI + 8) = pvVar4;
      }
      for (local_3c = 0; local_3c < local_14; local_3c = local_3c + 1) {
        directed_flag_complex_cell_t::boundary
                  ((directed_flag_complex_cell_t *)
                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   in_stack_ffffffffffffff70);
        ppVar5 = directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
                 get_data<directed_flag_complex_boundary_cell_t>
                           (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                            in_stack_ffffffffffffffa0);
        *(float *)(*(long *)(in_RDI + 8) + (long)local_3c * 4) = ppVar5->second;
      }
      local_24 = (**(code **)(**(long **)(in_RDI + 2) + 0x10))
                           (*(long **)(in_RDI + 2),(short)local_14 + -1,&local_38,
                            *(undefined8 *)(in_RDI + 4),*(undefined8 *)(in_RDI + 8));
    }
    std::vector<float,_std::allocator<float>_>::push_back
              (in_stack_ffffffffffffff80,
               (value_type_conflict2 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
              );
  }
  dimension = (int)((ulong)*(undefined8 *)(in_RDI + 6) >> 0x20);
  iVar2 = local_14 + -1;
  std::make_pair<int&,float&>((int *)in_stack_ffffffffffffff68,(float *)0x1beae8);
  directed_flag_complex_in_memory_t<std::pair<int,float>>::set_data<unsigned_short*>
            ((directed_flag_complex_in_memory_t<std::pair<int,_float>_> *)
             CONCAT44(iVar2,in_stack_ffffffffffffff78),dimension,in_stack_ffffffffffffff68,local_10)
  ;
  return;
}

Assistant:

void operator()(vertex_index_t* first_vertex, int size, std::pair<index_t, value_t>&) {
		// The index starts at -1, so the first cell gets index 0
		current_index++;

		value_t nf = 0.0f;

		if (filtration_algorithm != nullptr) {
			directed_flag_complex_cell_t cell(first_vertex);
			if (cell_hasher_t::dimension != size - 2) cell_hasher_t::set_current_cell_dimension(size - 2);

			if (filtration_algorithm->needs_face_filtration()) {
				if (boundary_filtration == nullptr) boundary_filtration = new value_t[size];

				for (int i = 0; i < size; i++) {
					boundary_filtration[i] = complex.get_data(size - 2, cell.boundary(i)).second;
				}

				nf = filtration_algorithm->compute_filtration(size - 1, cell, graph, boundary_filtration);
			} else {
				nf = filtration_algorithm->compute_filtration(size - 1, cell, graph, nullptr);
			}
			next_filtration.push_back(nf);
		}
		complex.set_data(size - 1, first_vertex, std::make_pair(current_index, nf));
	}